

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O3

void __thiscall QObject::~QObject(QObject *this)

{
  QBasicMutex *this_00;
  long lVar1;
  QAtomicInt *pQVar2;
  __pointer_type pQVar3;
  QObjectPrivate *this_01;
  _func_int **pp_Var4;
  __pointer_type pEVar5;
  ConnectionData *this_02;
  AtomicType AVar6;
  __pointer_type pQVar7;
  QObject *sender;
  ConnectionData *this_03;
  QObjectData *pQVar8;
  bool bVar9;
  int __sig;
  Sender *s;
  Sender *pSVar10;
  __sighandler_t p_Var11;
  ulong uVar12;
  undefined8 extraout_RDX;
  QBasicMutex *pQVar13;
  Connection *pCVar14;
  uint uVar15;
  uint uVar16;
  long in_FS_OFFSET;
  QSlotObjectBase *local_88;
  QObject *local_60;
  QMessageLogger local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this->_vptr_QObject = (_func_int **)&PTR_metaObject_0069b1d8;
  this_01 = (QObjectPrivate *)(this->d_ptr).d;
  *(uint *)&(this_01->super_QObjectData).field_0x30 =
       *(uint *)&(this_01->super_QObjectData).field_0x30 & 0xfffffff9 | 4;
  if (((this_01->super_QObjectData).bindingStorage.bindingStatus == (QBindingStatus *)0x0) &&
     (pp_Var4 = (this->d_ptr).d[1].q_ptr[5]._vptr_QObject, pp_Var4 != (_func_int **)0x0)) {
    QThreadPrivate::removeObjectWithPendingBindingStatusChange((QThreadPrivate *)pp_Var4[1],this);
  }
  QBindingStorage::clear(&(this_01->super_QObjectData).bindingStorage);
  pEVar5 = (this_01->sharedRefcount).
           super_QBasicAtomicPointer<QtSharedPointer::ExternalRefCountData>._q_value._M_b._M_p;
  if (pEVar5 != (__pointer_type)0x0) {
    if (0 < (__int_type_conflict)(pEVar5->strongref)._q_value.super___atomic_base<int>) {
      local_58.context.version = 2;
      local_58.context.line = 0;
      local_58.context.file._0_4_ = 0;
      local_58.context.file._4_4_ = 0;
      local_58.context.function._0_4_ = 0;
      local_58.context.function._4_4_ = 0;
      local_58.context.category = "default";
      QMessageLogger::warning
                (&local_58,
                 "QObject: shared QObject was deleted directly. The program is malformed and may crash."
                );
    }
    (pEVar5->strongref)._q_value.super___atomic_base<int> = (__atomic_base<int>)0x0;
    LOCK();
    (pEVar5->weakref)._q_value = (Type)((int)(pEVar5->weakref)._q_value + -1);
    UNLOCK();
    if ((__atomic_base<int>)*(__int_type_conflict *)&(pEVar5->weakref)._q_value ==
        (__atomic_base<int>)0x0) {
      operator_delete(pEVar5);
    }
  }
  if (((this_01->super_QObjectData).field_0x31 & 4) == 0) {
    bVar9 = QObjectPrivate::isSignalConnected(this_01,0,true);
    if (bVar9) {
      local_58.context.file = (char *)&local_60;
      local_58.context.version = 0;
      local_58.context.line = 0;
      local_60 = this;
      QMetaObject::activate(this,&staticMetaObject,0,(void **)&local_58);
    }
  }
  if ((((this_01->super_QObjectData).field_0x30 & 8) == 0) &&
     (QAbstractDeclarativeData::destroyed !=
      (_func_void_QAbstractDeclarativeData_ptr_QObject_ptr *)0x0 &&
      (this_01->field_3).declarativeData != (QAbstractDeclarativeData *)0x0)) {
    (*QAbstractDeclarativeData::destroyed)((this_01->field_3).declarativeData,this);
  }
  this_02 = (this_01->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>.
            _q_value._M_b._M_p;
  if (this_02 == (ConnectionData *)0x0) goto LAB_002afaf9;
  pSVar10 = this_02->currentSender;
  if (pSVar10 != (Sender *)0x0) {
    do {
      pSVar10->receiver = (QObject *)0x0;
      pSVar10 = pSVar10->previous;
    } while (pSVar10 != (Sender *)0x0);
    this_02->currentSender = (Sender *)0x0;
  }
  uVar15 = (int)this + (int)(((ulong)this & 0xffffffff) / 0x418) * -0x418;
  this_00 = (QBasicMutex *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)uVar15);
  if (*(long *)((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)uVar15) == 0) {
    LOCK();
    bVar9 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
    if (bVar9) {
      (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
    }
    UNLOCK();
    if (!bVar9) goto LAB_002af7fc;
  }
  else {
LAB_002af7fc:
    QBasicMutex::lockInternal(this_00);
  }
  if ((((__pointer_type)
       (this_02->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b
       )._M_p != (__pointer_type)0x0) &&
     (uVar16 = (uint)*(undefined8 *)
                      ((long)(this_02->signalVector).
                             super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value._M_b +
                      8), -1 < (int)uVar16)) {
    uVar12 = 0xffffffffffffffff;
    do {
      AVar6._M_b._M_p =
           (this_02->signalVector).super_QBasicAtomicPointer<QObjectPrivate::SignalVector>._q_value.
           _M_b;
      pCVar14 = *(Connection **)((long)AVar6._M_b._M_p + 0x20 + uVar12 * 0x10);
      if (pCVar14 != (Connection *)0x0) {
        lVar1 = (long)AVar6._M_b._M_p + uVar12 * 0x10;
        do {
          pQVar7 = (pCVar14->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p;
          pQVar13 = (QBasicMutex *)
                    ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p +
                    (ulong)((int)pQVar7 + (int)(((ulong)pQVar7 & 0xffffffff) / 0x418) * -0x418 &
                           0x7f8));
          bVar9 = QOrderedMutexLocker::relock(this_00,pQVar13);
          if ((pCVar14 == *(Connection **)(lVar1 + 0x20)) &&
             ((pCVar14->receiver).super_QBasicAtomicPointer<QObject>._q_value._M_b._M_p !=
              (__pointer_type)0x0)) {
            QObjectPrivate::ConnectionData::removeConnection(this_02,pCVar14);
          }
          if (bVar9) {
            LOCK();
            pQVar3 = (pQVar13->d_ptr)._q_value._M_b._M_p;
            (pQVar13->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
            UNLOCK();
            if (pQVar3 != (__pointer_type)0x1) {
              QBasicMutex::unlockInternalFutex(pQVar13,pQVar3);
            }
          }
          pCVar14 = *(Connection **)(lVar1 + 0x20);
        } while (pCVar14 != (Connection *)0x0);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != (uVar16 & 0x7fffffff));
  }
  pCVar14 = this_02->senders;
  if (pCVar14 != (Connection *)0x0) {
    do {
      sender = pCVar14->sender;
      __sig = (**sender->_vptr_QObject)(sender);
      p_Var11 = QMetaObjectPrivate::signal
                          (__sig,(__sighandler_t)
                                 (ulong)(uint)((*(int *)&pCVar14->field_0x54 << 5) >> 5));
      local_58.context.version = (int)p_Var11;
      local_58.context.line = (int)((ulong)p_Var11 >> 0x20);
      local_58.context.file._0_4_ = (undefined4)extraout_RDX;
      local_58.context.file._4_4_ = (undefined4)((ulong)extraout_RDX >> 0x20);
      (*sender->_vptr_QObject[0xb])(sender,&local_58);
      uVar16 = (int)sender + (int)(((ulong)sender & 0xffffffff) / 0x418) * -0x418;
      pQVar13 = (QBasicMutex *)
                ((long)&_q_ObjectMutexPool[0].d_ptr._q_value._M_b._M_p + (ulong)(uVar16 & 0x7f8));
      bVar9 = QOrderedMutexLocker::relock(this_00,pQVar13);
      if (pCVar14 == this_02->senders) {
        this_03 = (ConnectionData *)(sender->d_ptr).d[1].parent;
        if ((*(uint *)&pCVar14->field_0x54 >> 0x1d & 1) == 0) {
          local_88 = (QSlotObjectBase *)0x0;
        }
        else {
          local_88 = (pCVar14->field_6).slotObj;
          *(uint *)&pCVar14->field_0x54 = *(uint *)&pCVar14->field_0x54 & 0xdfffffff;
        }
        uVar16 = uVar16 >> 3;
        QObjectPrivate::ConnectionData::removeConnection(this_03,pCVar14);
        if (uVar15 >> 3 != uVar16) {
          LOCK();
          pQVar3 = (this_00->d_ptr)._q_value._M_b._M_p;
          (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
          if (pQVar3 != (__pointer_type)0x1) {
            QBasicMutex::unlockInternalFutex(this_00,pQVar3);
          }
        }
        if (((this_03->orphaned)._M_i.c != 0) &&
           ((this_03->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
            super___atomic_base<int>._M_i == 1)) {
          QObjectPrivate::ConnectionData::cleanOrphanedConnectionsImpl
                    (this_03,sender,AlreadyLockedAndTemporarilyReleasingLock);
        }
        if (bVar9) {
          LOCK();
          pQVar3 = (pQVar13->d_ptr)._q_value._M_b._M_p;
          (pQVar13->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
          if (pQVar3 != (__pointer_type)0x1) {
            QBasicMutex::unlockInternalFutex(pQVar13,pQVar3);
          }
        }
        if (uVar15 >> 3 == uVar16) {
          LOCK();
          pQVar3 = (this_00->d_ptr)._q_value._M_b._M_p;
          (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
          UNLOCK();
          if (pQVar3 != (__pointer_type)0x1) {
            QBasicMutex::unlockInternalFutex(this_00,pQVar3);
          }
        }
        if (local_88 != (QSlotObjectBase *)0x0) {
          LOCK();
          (local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
          super___atomic_base<int>._M_i =
               (local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
               super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if ((local_88->m_ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
              super___atomic_base<int>._M_i == 0) {
            (*local_88->m_impl)(0,local_88,(QObject *)0x0,(void **)0x0,(bool *)0x0);
          }
        }
        if ((this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0) {
          LOCK();
          bVar9 = (this_00->d_ptr)._q_value._M_b._M_p == (__pointer_type)0x0;
          if (bVar9) {
            (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x1;
          }
          UNLOCK();
          if (bVar9) goto LAB_002afaa7;
        }
        QBasicMutex::lockInternal(this_00);
      }
      else {
        LOCK();
        pQVar3 = (pQVar13->d_ptr)._q_value._M_b._M_p;
        (pQVar13->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
        UNLOCK();
        if (pQVar3 != (__pointer_type)0x1) {
          QBasicMutex::unlockInternalFutex(pQVar13,pQVar3);
        }
      }
LAB_002afaa7:
      pCVar14 = this_02->senders;
    } while (pCVar14 != (Connection *)0x0);
  }
  (this_02->currentConnectionId).super_QBasicAtomicInteger<unsigned_int>._q_value = (Type)0x0;
  LOCK();
  pQVar3 = (this_00->d_ptr)._q_value._M_b._M_p;
  (this_00->d_ptr)._q_value._M_b._M_p = (__pointer_type)0x0;
  UNLOCK();
  if (pQVar3 != (__pointer_type)0x1) {
    QBasicMutex::unlockInternalFutex(this_00,pQVar3);
  }
  LOCK();
  pQVar2 = &this_02->ref;
  (pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value =
       (Type)((int)(pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value + -1)
  ;
  UNLOCK();
  if ((__atomic_base<int>)
      *(__int_type_conflict *)
       &(pQVar2->super_QAtomicInteger<int>).super_QBasicAtomicInteger<int>._q_value ==
      (__atomic_base<int>)0x0) {
    QObjectPrivate::ConnectionData::~ConnectionData(this_02);
    operator_delete(this_02,0x28);
  }
LAB_002afaf9:
  (this_01->connections).super_QBasicAtomicPointer<QObjectPrivate::ConnectionData>._q_value._M_b.
  _M_p = (__pointer_type)0x0;
  if ((this_01->super_QObjectData).children.d.size != 0) {
    QObjectPrivate::deleteChildren(this_01);
  }
  if (qtHookData[4] != 0) {
    (*(code *)qtHookData[4])(this);
  }
  if ((this_01->super_QObjectData).parent != (QObject *)0x0) {
    QObjectPrivate::setParent_helper(this_01,(QObject *)0x0);
  }
  pQVar8 = (this->d_ptr).d;
  if (pQVar8 != (QObjectData *)0x0) {
    (*pQVar8->_vptr_QObjectData[1])();
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

QObject::~QObject()
{
    Q_D(QObject);
    d->wasDeleted = true;
    d->blockSig = 0; // unblock signals so we always emit destroyed()

    if (!d->bindingStorage.isValid()) {
        // this might be the case after an incomplete thread-move
        // remove this object from the pending list in that case
        if (QThread *ownThread = thread()) {
            auto *privThread = static_cast<QThreadPrivate *>(
                        QObjectPrivate::get(ownThread));
            privThread->removeObjectWithPendingBindingStatusChange(this);
        }
    }

    // If we reached this point, we need to clear the binding data
    // as the corresponding properties are no longer useful
    d->clearBindingStorage();

    QtSharedPointer::ExternalRefCountData *sharedRefcount = d->sharedRefcount.loadRelaxed();
    if (sharedRefcount) {
        if (sharedRefcount->strongref.loadRelaxed() > 0) {
            qWarning("QObject: shared QObject was deleted directly. The program is malformed and may crash.");
            // but continue deleting, it's too late to stop anyway
        }

        // indicate to all QWeakPointers that this QObject has now been deleted
        sharedRefcount->strongref.storeRelaxed(0);
        if (!sharedRefcount->weakref.deref())
            delete sharedRefcount;
    }

    if (!d->wasWidget && d->isSignalConnected(0)) {
        emit destroyed(this);
    }

    if (!d->isDeletingChildren && d->declarativeData && QAbstractDeclarativeData::destroyed)
        QAbstractDeclarativeData::destroyed(d->declarativeData, this);

    QObjectPrivate::ConnectionData *cd = d->connections.loadAcquire();
    if (cd) {
        if (cd->currentSender) {
            cd->currentSender->receiverDeleted();
            cd->currentSender = nullptr;
        }

        QBasicMutex *signalSlotMutex = signalSlotLock(this);
        QMutexLocker locker(signalSlotMutex);

        // disconnect all receivers
        int receiverCount = cd->signalVectorCount();
        for (int signal = -1; signal < receiverCount; ++signal) {
            QObjectPrivate::ConnectionList &connectionList = cd->connectionsForSignal(signal);

            while (QObjectPrivate::Connection *c = connectionList.first.loadRelaxed()) {
                Q_ASSERT(c->receiver.loadAcquire());

                QBasicMutex *m = signalSlotLock(c->receiver.loadRelaxed());
                bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
                if (c == connectionList.first.loadAcquire() && c->receiver.loadAcquire()) {
                    cd->removeConnection(c);
                    Q_ASSERT(connectionList.first.loadRelaxed() != c);
                }
                if (needToUnlock)
                    m->unlock();
            }
        }

        /* Disconnect all senders:
         */
        while (QObjectPrivate::Connection *node = cd->senders) {
            Q_ASSERT(node->receiver.loadAcquire());
            QObject *sender = node->sender;
            // Send disconnectNotify before removing the connection from sender's connection list.
            // This ensures any eventual destructor of sender will block on getting receiver's lock
            // and not finish until we release it.
            sender->disconnectNotify(QMetaObjectPrivate::signal(sender->metaObject(), node->signal_index));
            QBasicMutex *m = signalSlotLock(sender);
            bool needToUnlock = QOrderedMutexLocker::relock(signalSlotMutex, m);
            //the node has maybe been removed while the mutex was unlocked in relock?
            if (node != cd->senders) {
                // We hold the wrong mutex
                Q_ASSERT(needToUnlock);
                m->unlock();
                continue;
            }

            QObjectPrivate::ConnectionData *senderData = sender->d_func()->connections.loadRelaxed();
            Q_ASSERT(senderData);

            QtPrivate::QSlotObjectBase *slotObj = nullptr;
            if (node->isSlotObject) {
                slotObj = node->slotObj;
                node->isSlotObject = false;
            }

            senderData->removeConnection(node);
            /*
              When we unlock, another thread has the chance to delete/modify sender data.
              Thus we need to call cleanOrphanedConnections before unlocking. We use the
              variant of the function which assumes that the lock is already held to avoid
              a deadlock.
              We need to hold m, the sender lock. Considering that we might execute arbitrary user
              code, we should already release the signalSlotMutex here – unless they are the same.
            */
            const bool locksAreTheSame = signalSlotMutex == m;
            if (!locksAreTheSame)
                locker.unlock();
            senderData->cleanOrphanedConnections(
                        sender,
                        QObjectPrivate::ConnectionData::AlreadyLockedAndTemporarilyReleasingLock
                        );
            if (needToUnlock)
                m->unlock();

            if (locksAreTheSame) // otherwise already unlocked
                locker.unlock();
            if (slotObj)
                slotObj->destroyIfLastRef();
            locker.relock();
        }

        // invalidate all connections on the object and make sure
        // activate() will skip them
        cd->currentConnectionId.storeRelaxed(0);
    }
    if (cd && !cd->ref.deref())
        delete cd;
    d->connections.storeRelaxed(nullptr);

    if (!d->children.isEmpty())
        d->deleteChildren();

    if (Q_UNLIKELY(qtHookData[QHooks::RemoveQObject]))
        reinterpret_cast<QHooks::RemoveQObjectCallback>(qtHookData[QHooks::RemoveQObject])(this);

    Q_TRACE(QObject_dtor, this);

    if (d->parent)        // remove it from parent object
        d->setParent_helper(nullptr);
}